

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

void __thiscall Calculator::loadFile(Calculator *this,string *fileName,bool printIfNotFound)

{
  byte bVar1;
  ostream *poVar2;
  undefined1 local_258 [8];
  string line;
  istream local_228 [8];
  ifstream stream;
  bool printIfNotFound_local;
  string *fileName_local;
  Calculator *this_local;
  
  std::ifstream::ifstream(local_228,fileName,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    if (printIfNotFound) {
      poVar2 = std::operator<<(this->mOutputStream,"Could not open the file \'");
      poVar2 = std::operator<<(poVar2,(string *)fileName);
      poVar2 = std::operator<<(poVar2,"\'.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_258);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,(string *)local_258);
      execute(this,(string *)local_258,false);
    }
    std::__cxx11::string::~string((string *)local_258);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void Calculator::loadFile(const std::string& fileName, bool printIfNotFound) {
	std::ifstream stream(fileName);

	if (stream.is_open()) {
		std::string line;

		while (!stream.eof()) {
			std::getline(stream, line);
			execute(line, false);
		}
	} else if (printIfNotFound) {
		mOutputStream << "Could not open the file '" << fileName << "'." << std::endl;
	}
}